

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_relocate(Tree *this,substr next_arena)

{
  size_t sVar1;
  NodeData *pNVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  code *pcVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  long lVar11;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  csubstr s_02;
  csubstr s_03;
  csubstr s_04;
  csubstr s_05;
  csubstr s_06;
  substr sVar12;
  char msg [39];
  char local_68 [56];
  
  if (next_arena.len == 0 || next_arena.str == (char *)0x0) {
    builtin_strncpy(local_68,"check failed: (next_arena.not_empty())",0x27);
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x630b) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x630b) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_68,0x27,LVar8,(this->m_callbacks).m_user_data);
  }
  if (next_arena.len < (this->m_arena).len) {
    builtin_strncpy(local_68 + 0x10,"ext_arena.len >= m_arena.len)",0x1e);
    builtin_strncpy(local_68,"check failed: (n",0x10);
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x630c) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x630c) << 0x40,8);
    LVar9.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar9.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_68,0x2e,LVar9,(this->m_callbacks).m_user_data);
  }
  memcpy(next_arena.str,(this->m_arena).str,this->m_arena_pos);
  sVar1 = this->m_cap;
  if (sVar1 != 0) {
    pNVar2 = this->m_buf;
    lVar11 = 0;
    do {
      pcVar3 = *(char **)((long)&(pNVar2->m_key).scalar.str + lVar11);
      sVar4 = *(size_t *)((long)&(pNVar2->m_key).scalar.len + lVar11);
      sVar5 = (this->m_arena).len;
      if (sVar5 == 0) {
        if (sVar4 == 0) {
          pcVar6 = (this->m_arena).str;
          bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
          goto LAB_001bb387;
        }
      }
      else {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar3 + sVar4 <= pcVar6 + sVar5 && pcVar6 <= pcVar3;
LAB_001bb387:
        if (bVar10) {
          s.len = sVar4;
          s.str = pcVar3;
          sVar12 = _relocated(this,s,next_arena);
          *(char **)((long)&(pNVar2->m_key).scalar.str + lVar11) = sVar12.str;
          *(size_t *)((long)&(pNVar2->m_key).scalar.len + lVar11) = sVar12.len;
        }
      }
      pcVar3 = *(char **)((long)&(pNVar2->m_key).tag.str + lVar11);
      sVar4 = *(size_t *)((long)&(pNVar2->m_key).tag.len + lVar11);
      sVar5 = (this->m_arena).len;
      if (sVar5 == 0) {
        if (sVar4 == 0) {
          pcVar6 = (this->m_arena).str;
          bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
          goto LAB_001bb3d5;
        }
      }
      else {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar3 + sVar4 <= pcVar6 + sVar5 && pcVar6 <= pcVar3;
LAB_001bb3d5:
        if (bVar10) {
          s_00.len = sVar4;
          s_00.str = pcVar3;
          sVar12 = _relocated(this,s_00,next_arena);
          *(char **)((long)&(pNVar2->m_key).tag.str + lVar11) = sVar12.str;
          *(size_t *)((long)&(pNVar2->m_key).tag.len + lVar11) = sVar12.len;
        }
      }
      pcVar3 = *(char **)((long)&(pNVar2->m_key).anchor.str + lVar11);
      sVar4 = *(size_t *)((long)&(pNVar2->m_key).anchor.len + lVar11);
      sVar5 = (this->m_arena).len;
      if (sVar5 == 0) {
        if (sVar4 == 0) {
          pcVar6 = (this->m_arena).str;
          bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
          goto LAB_001bb423;
        }
      }
      else {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar3 + sVar4 <= pcVar6 + sVar5 && pcVar6 <= pcVar3;
LAB_001bb423:
        if (bVar10) {
          s_01.len = sVar4;
          s_01.str = pcVar3;
          sVar12 = _relocated(this,s_01,next_arena);
          *(char **)((long)&(pNVar2->m_key).anchor.str + lVar11) = sVar12.str;
          *(size_t *)((long)&(pNVar2->m_key).anchor.len + lVar11) = sVar12.len;
        }
      }
      pcVar3 = *(char **)((long)&(pNVar2->m_val).scalar.str + lVar11);
      sVar4 = *(size_t *)((long)&(pNVar2->m_val).scalar.len + lVar11);
      sVar5 = (this->m_arena).len;
      if (sVar5 == 0) {
        if (sVar4 == 0) {
          pcVar6 = (this->m_arena).str;
          bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
          goto LAB_001bb471;
        }
      }
      else {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar3 + sVar4 <= pcVar6 + sVar5 && pcVar6 <= pcVar3;
LAB_001bb471:
        if (bVar10) {
          s_02.len = sVar4;
          s_02.str = pcVar3;
          sVar12 = _relocated(this,s_02,next_arena);
          *(char **)((long)&(pNVar2->m_val).scalar.str + lVar11) = sVar12.str;
          *(size_t *)((long)&(pNVar2->m_val).scalar.len + lVar11) = sVar12.len;
        }
      }
      pcVar3 = *(char **)((long)&(pNVar2->m_val).tag.str + lVar11);
      sVar4 = *(size_t *)((long)&(pNVar2->m_val).tag.len + lVar11);
      sVar5 = (this->m_arena).len;
      if (sVar5 == 0) {
        if (sVar4 == 0) {
          pcVar6 = (this->m_arena).str;
          bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
          goto LAB_001bb4bf;
        }
      }
      else {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar3 + sVar4 <= pcVar6 + sVar5 && pcVar6 <= pcVar3;
LAB_001bb4bf:
        if (bVar10) {
          s_03.len = sVar4;
          s_03.str = pcVar3;
          sVar12 = _relocated(this,s_03,next_arena);
          *(char **)((long)&(pNVar2->m_val).tag.str + lVar11) = sVar12.str;
          *(size_t *)((long)&(pNVar2->m_val).tag.len + lVar11) = sVar12.len;
        }
      }
      pcVar3 = *(char **)((long)&(pNVar2->m_val).anchor.str + lVar11);
      sVar4 = *(size_t *)((long)&(pNVar2->m_val).anchor.len + lVar11);
      sVar5 = (this->m_arena).len;
      if (sVar5 == 0) {
        if (sVar4 == 0) {
          pcVar6 = (this->m_arena).str;
          bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
          goto LAB_001bb50d;
        }
      }
      else {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar3 + sVar4 <= pcVar6 + sVar5 && pcVar6 <= pcVar3;
LAB_001bb50d:
        if (bVar10) {
          s_04.len = sVar4;
          s_04.str = pcVar3;
          sVar12 = _relocated(this,s_04,next_arena);
          *(char **)((long)&(pNVar2->m_val).anchor.str + lVar11) = sVar12.str;
          *(size_t *)((long)&(pNVar2->m_val).anchor.len + lVar11) = sVar12.len;
        }
      }
      lVar11 = lVar11 + 0x90;
    } while (sVar1 * 0x90 != lVar11);
  }
  lVar11 = 0x78;
  do {
    pcVar3 = *(char **)((long)this->m_tag_directives + lVar11 + -0x68);
    sVar1 = *(size_t *)((long)this->m_tag_directives + lVar11 + -0x60);
    sVar4 = (this->m_arena).len;
    if (sVar4 == 0) {
      if (sVar1 == 0) {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
        goto LAB_001bb635;
      }
    }
    else {
      pcVar6 = (this->m_arena).str;
      bVar10 = pcVar3 + sVar1 <= pcVar6 + sVar4 && pcVar6 <= pcVar3;
LAB_001bb635:
      if (bVar10) {
        s_05.len = sVar1;
        s_05.str = pcVar3;
        sVar12 = _relocated(this,s_05,next_arena);
        *(char **)((long)this->m_tag_directives + lVar11 + -0x68) = sVar12.str;
        *(size_t *)((long)this->m_tag_directives + lVar11 + -0x60) = sVar12.len;
      }
    }
    pcVar3 = *(char **)((long)(this->m_tag_directives + -3) + lVar11);
    sVar1 = *(size_t *)((long)this->m_tag_directives + lVar11 + -0x70);
    sVar4 = (this->m_arena).len;
    if (sVar4 == 0) {
      if (sVar1 == 0) {
        pcVar6 = (this->m_arena).str;
        bVar10 = pcVar6 != (char *)0x0 && pcVar6 == pcVar3;
        goto LAB_001bb67e;
      }
    }
    else {
      pcVar6 = (this->m_arena).str;
      bVar10 = pcVar3 + sVar1 <= pcVar6 + sVar4 && pcVar6 <= pcVar3;
LAB_001bb67e:
      if (bVar10) {
        s_06.len = sVar1;
        s_06.str = pcVar3;
        sVar12 = _relocated(this,s_06,next_arena);
        *(char **)((long)(this->m_tag_directives + -3) + lVar11) = sVar12.str;
        *(size_t *)((long)this->m_tag_directives + lVar11 + -0x70) = sVar12.len;
      }
    }
    lVar11 = lVar11 + 0x28;
    if (lVar11 == 0x118) {
      return;
    }
  } while( true );
}

Assistant:

void Tree::_relocate(substr next_arena)
{
    _RYML_CB_ASSERT(m_callbacks, next_arena.not_empty());
    _RYML_CB_ASSERT(m_callbacks, next_arena.len >= m_arena.len);
    memcpy(next_arena.str, m_arena.str, m_arena_pos);
    for(NodeData *C4_RESTRICT n = m_buf, *e = m_buf + m_cap; n != e; ++n)
    {
        if(in_arena(n->m_key.scalar))
            n->m_key.scalar = _relocated(n->m_key.scalar, next_arena);
        if(in_arena(n->m_key.tag))
            n->m_key.tag = _relocated(n->m_key.tag, next_arena);
        if(in_arena(n->m_key.anchor))
            n->m_key.anchor = _relocated(n->m_key.anchor, next_arena);
        if(in_arena(n->m_val.scalar))
            n->m_val.scalar = _relocated(n->m_val.scalar, next_arena);
        if(in_arena(n->m_val.tag))
            n->m_val.tag = _relocated(n->m_val.tag, next_arena);
        if(in_arena(n->m_val.anchor))
            n->m_val.anchor = _relocated(n->m_val.anchor, next_arena);
    }
    for(TagDirective &C4_RESTRICT td : m_tag_directives)
    {
        if(in_arena(td.prefix))
            td.prefix = _relocated(td.prefix, next_arena);
        if(in_arena(td.handle))
            td.handle = _relocated(td.handle, next_arena);
    }
}